

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O0

Application * __thiscall
ApplicationFactory::make(Application *__return_storage_ptr__,ApplicationFactory *this)

{
  unique_ptr<solitaire::time::interfaces::FPSLimiter,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
  local_60;
  unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  local_58;
  unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  local_50;
  unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
  local_48;
  unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  local_40;
  unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  renderer;
  unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  local_28;
  unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  eventsProcessor;
  unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
  context;
  ApplicationFactory *this_local;
  
  makeContext((ApplicationFactory *)&eventsProcessor);
  std::
  unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>::
  operator*((unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
             *)&eventsProcessor);
  makeEventsProcessor((ApplicationFactory *)&local_28,(Context *)this);
  std::
  unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>::
  operator*((unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
             *)&eventsProcessor);
  makeRenderer((ApplicationFactory *)&local_40,(Context *)this);
  std::
  unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>::
  unique_ptr(&local_48,
             (unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
              *)&eventsProcessor);
  std::
  unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  ::unique_ptr(&local_50,&local_28);
  std::
  unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  ::unique_ptr(&local_58,&local_40);
  makeFPSLimiter((ApplicationFactory *)&local_60);
  solitaire::Application::Application
            (__return_storage_ptr__,&local_48,&local_50,&local_58,&local_60);
  std::
  unique_ptr<solitaire::time::interfaces::FPSLimiter,_std::default_delete<solitaire::time::interfaces::FPSLimiter>_>
  ::~unique_ptr(&local_60);
  std::
  unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  ::~unique_ptr(&local_58);
  std::
  unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  ::~unique_ptr(&local_50);
  std::
  unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>::
  ~unique_ptr(&local_48);
  std::
  unique_ptr<solitaire::graphics::interfaces::Renderer,_std::default_delete<solitaire::graphics::interfaces::Renderer>_>
  ::~unique_ptr(&local_40);
  std::
  unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
  ::~unique_ptr(&local_28);
  std::
  unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>::
  ~unique_ptr((unique_ptr<solitaire::interfaces::Context,_std::default_delete<solitaire::interfaces::Context>_>
               *)&eventsProcessor);
  return __return_storage_ptr__;
}

Assistant:

Application ApplicationFactory::make() const {
    auto context = makeContext();
    auto eventsProcessor = makeEventsProcessor(*context);
    auto renderer = makeRenderer(*context);

    return Application {std::move(context), std::move(eventsProcessor),
                        std::move(renderer), makeFPSLimiter()};
}